

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O3

int lws_token_from_index(lws *wsi,int index,char **arg,int *len,uint32_t *hdr_len)

{
  lws_h2_netconn *plVar1;
  char *__s;
  lws *wsi_00;
  size_t sVar2;
  hpack_dt_entry *phVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  
  uVar4 = 0xffff;
  if (index != 0xffff) {
    wsi_00 = lws_get_network_wsi(wsi);
    plVar1 = (wsi_00->h2).h2n;
    uVar4 = 0xffffffff;
    if ((plVar1 != (lws_h2_netconn *)0x0) && (-1 < index)) {
      if ((uint)index < 0x3e) {
        if ((uint)index < 0x11 && arg != (char **)0x0) {
          __s = http2_canned[(uint)index];
          *arg = __s;
          sVar2 = strlen(__s);
          *len = (int)sVar2;
        }
        if (hdr_len != (uint32_t *)0x0) {
          *hdr_len = (uint)""[(uint)index];
        }
        uVar4 = (uint)""[(uint)index];
      }
      else if ((uint)index < (plVar1->hpack_dyn_table).used_entries + 0x3e) {
        uVar4 = (uint)(plVar1->hpack_dyn_table).num_entries;
        iVar6 = (int)(((uint)(plVar1->hpack_dyn_table).pos - index) + 0x3d) % (int)uVar4;
        lVar5 = (long)(int)((iVar6 >> 0x1f & uVar4) + iVar6);
        _lws_log(0x40,"%s: dyn index %d, tok %d\n","lws_token_from_index",lVar5,
                 (ulong)(plVar1->hpack_dyn_table).entries[lVar5].lws_hdr_idx);
        phVar3 = (plVar1->hpack_dyn_table).entries;
        if (len != (int *)0x0 && arg != (char **)0x0) {
          *arg = phVar3[lVar5].value;
          phVar3 = (plVar1->hpack_dyn_table).entries;
          *len = (uint)phVar3[lVar5].value_len;
        }
        if (hdr_len != (uint32_t *)0x0) {
          *hdr_len = (uint)phVar3[lVar5].hdr_len;
        }
        uVar4 = (uint)phVar3[lVar5].lws_hdr_idx;
      }
      else {
        _lws_log(8,"  %s: adjusted index %d >= %d\n","lws_token_from_index",(ulong)(uint)index);
        lws_h2_goaway(wsi_00,9,"index out of range");
      }
    }
  }
  return uVar4;
}

Assistant:

static int
lws_token_from_index(struct lws *wsi, int index, const char **arg, int *len,
		     uint32_t *hdr_len)
{
	struct hpack_dynamic_table *dyn;

	if (index == LWS_HPACK_IGNORE_ENTRY)
		return LWS_HPACK_IGNORE_ENTRY;

	/* dynamic table only belongs to network wsi */
	wsi = lws_get_network_wsi(wsi);
	if (!wsi->h2.h2n)
		return -1;

	dyn = &wsi->h2.h2n->hpack_dyn_table;

	if (index < 0)
		return -1;

	if (index < (int)LWS_ARRAY_SIZE(static_token)) {
		if (arg && index < (int)LWS_ARRAY_SIZE(http2_canned)) {
			*arg = http2_canned[index];
			*len = (int)strlen(http2_canned[index]);
		}
		if (hdr_len)
			*hdr_len = static_hdr_len[index];

		return static_token[index];
	}

	if (!dyn) {
		lwsl_notice("no dynamic table\n");
		return -1;
	}

	if (index >= (int)LWS_ARRAY_SIZE(static_token) + dyn->used_entries) {
		lwsl_info("  %s: adjusted index %d >= %d\n", __func__, index,
				(int)LWS_ARRAY_SIZE(static_token) + dyn->used_entries);
		lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
			      "index out of range");
		return -1;
	}

	index -= (int)LWS_ARRAY_SIZE(static_token);
	index = (dyn->pos - 1 - index) % dyn->num_entries;
	if (index < 0)
		index += dyn->num_entries;

	lwsl_header("%s: dyn index %d, tok %d\n", __func__, index,
		    dyn->entries[index].lws_hdr_idx);

	if (arg && len) {
		*arg = dyn->entries[index].value;
		*len = dyn->entries[index].value_len;
	}

	if (hdr_len)
		*hdr_len = dyn->entries[index].hdr_len;

	return dyn->entries[index].lws_hdr_idx;
}